

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest_tests.cpp
# Opt level: O0

void __thiscall rest_tests::test_query_string::test_method(test_query_string *this)

{
  bool bVar1;
  string *strReq;
  long in_FS_OFFSET;
  RESTResponseFormat rf;
  string param;
  char *in_stack_fffffffffffff958;
  char *in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  lazy_ostream *in_stack_fffffffffffff988;
  const_string *in_stack_fffffffffffff990;
  string *psVar2;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  char *in_stack_fffffffffffff9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a8;
  string *in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d0;
  lazy_ostream local_4dc;
  undefined1 local_4c8 [64];
  undefined1 local_488 [16];
  undefined1 local_478 [67];
  allocator<char> local_435;
  lazy_ostream local_434;
  undefined1 local_420 [64];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [67];
  allocator<char> local_38d;
  lazy_ostream local_38c;
  undefined1 local_378 [64];
  undefined1 local_338 [16];
  undefined1 local_328 [67];
  allocator<char> local_2e5;
  lazy_ostream local_2e4;
  undefined1 local_2d0 [64];
  undefined1 local_290 [16];
  undefined1 local_280 [67];
  allocator<char> local_23d;
  lazy_ostream local_23c;
  undefined1 local_228 [64];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [67];
  allocator<char> local_195;
  lazy_ostream local_194;
  undefined1 local_180 [64];
  undefined1 local_140 [16];
  undefined1 local_130 [67];
  allocator<char> local_ed;
  RESTResponseFormat local_ec [49];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_fffffffffffff970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_ed);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_130,local_140,0x14,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_194._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff968 = "RESTResponseFormat::JSON";
    in_stack_fffffffffffff960 = (char *)&local_194;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_180,(undefined1 *)((long)&local_194._vptr_lazy_ostream + 4),0x15,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_195);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_1d8,local_1e8,0x19,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_23c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff968 = "RESTResponseFormat::BINARY";
    in_stack_fffffffffffff960 = (char *)&local_23c;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_228,(undefined1 *)((long)&local_23c._vptr_lazy_ostream + 4),0x1a,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_23d);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_280,local_290,0x1e,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_2e4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff968 = "RESTResponseFormat::HEX";
    in_stack_fffffffffffff960 = (char *)&local_2e4;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_2d0,(undefined1 *)((long)&local_2e4._vptr_lazy_ostream + 4),0x1f,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_2e5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource.json&p1=v1\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource.json&p1=v1";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[39]>
              (local_328,local_338,0x23,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_38c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff968 = "RESTResponseFormat::UNDEF";
    in_stack_fffffffffffff960 = (char *)&local_38c;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_378,(undefined1 *)((long)&local_38c._vptr_lazy_ostream + 4),0x24,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_38d);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_3d0,local_3e0,0x28,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    psVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    strReq = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_434._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff968 = "RESTResponseFormat::UNDEF";
    in_stack_fffffffffffff960 = (char *)&local_434;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_420,(undefined1 *)((long)&local_434._vptr_lazy_ostream + 4),0x29,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_ec[0] = ParseDataFormat(psVar2,strReq);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  std::allocator<char>::~allocator(&local_435);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    in_stack_fffffffffffff968 = "\"/rest/endpoint/someresource\"";
    in_stack_fffffffffffff960 = "/rest/endpoint/someresource";
    in_stack_fffffffffffff958 = "param";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_478,local_488,0x2d,1,2,local_28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    in_stack_fffffffffffff99f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff99f);
  do {
    psVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (const_string *)psVar2,(size_t)in_stack_fffffffffffff988,
               (const_string *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    in_stack_fffffffffffff988 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff960,(char (*) [1])in_stack_fffffffffffff958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               (unsigned_long)in_stack_fffffffffffff958);
    local_4dc._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff968 = "RESTResponseFormat::UNDEF";
    in_stack_fffffffffffff960 = (char *)&local_4dc;
    in_stack_fffffffffffff958 = "rf";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
              (local_4c8,(undefined1 *)((long)&local_4dc._vptr_lazy_ostream + 4),0x2e,1,2,local_ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff958);
    in_stack_fffffffffffff987 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff987);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff958);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_query_string)
{
    std::string param;
    RESTResponseFormat rf;
    // No query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::JSON);

    // Query string with single parameter
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.bin?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::BINARY);

    // Query string with multiple parameters
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.hex?p1=v1&p2=v2");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::HEX);

    // Incorrectly formed query string will not be handled
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Omitted data format with query string should return UNDEF and hide query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Data format specified after query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);
}